

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall FInterpolator::DoInterpolations(FInterpolator *this,double smoothratio)

{
  DInterpolation *pDVar1;
  DInterpolation *next;
  DInterpolation *probe;
  double smoothratio_local;
  FInterpolator *this_local;
  
  if (smoothratio < 1.0) {
    this->didInterp = true;
    next = ::TObjPtr::operator_cast_to_DInterpolation_((TObjPtr *)this);
    while (next != (DInterpolation *)0x0) {
      pDVar1 = ::TObjPtr::operator_cast_to_DInterpolation_((TObjPtr *)&next->Next);
      (*(next->super_DObject)._vptr_DObject[9])(smoothratio);
      next = pDVar1;
    }
  }
  else {
    this->didInterp = false;
  }
  return;
}

Assistant:

void FInterpolator::DoInterpolations(double smoothratio)
{
	if (smoothratio >= 1.)
	{
		didInterp = false;
		return;
	}

	didInterp = true;

	DInterpolation *probe = Head;
	while (probe != NULL)
	{
		DInterpolation *next = probe->Next;
		probe->Interpolate(smoothratio);
		probe = next;
	}
}